

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SDMMCAnalyzerResults::GenerateBubbleText
          (SDMMCAnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  char **ppcVar5;
  char local_a80 [8];
  char str_crc_2 [8];
  char str_crc_1 [8];
  char str_crc [8];
  char rsp_str_1 [64];
  string local_a20 [8];
  string res_1;
  uint psn;
  uint prv;
  char rsp_str [64];
  char local_9b0 [8];
  char psn_str [12];
  char prv_str [4];
  char pname [7];
  string res;
  allocator local_971;
  string local_970 [8];
  string str_flags;
  char *local_950;
  char *str_state;
  char str_32 [33];
  int rd_wr;
  int stuff_4;
  char str_rd_wr [33];
  char local_8e8 [8];
  char str_stuff_4 [33];
  int reserv;
  int sec_prot;
  int sec_spec;
  char str_reserv [33];
  char local_888 [8];
  char str_sec_prot [33];
  char local_858 [8];
  char str_sec_spec [33];
  int reg_data;
  int reg_addr;
  int reg_wflag;
  int rca_3;
  char str_reg_data [33];
  char local_7e8 [8];
  char str_reg_addr [33];
  char local_7b8 [8];
  char str_reg_wflag [33];
  char local_788 [8];
  char str_rca_3 [33];
  int ident_writeblocks;
  int discard_en;
  int forcegarb;
  int securereq;
  char str_ident_writeblocks [33];
  char local_718 [8];
  char str_discard_en [33];
  char local_6e8 [8];
  char str_forcegarb [33];
  char local_6b8 [8];
  char str_securereq [33];
  int num_blocks2;
  int p_zero2;
  int p_one;
  int p_zero;
  int num_blocks;
  int forced;
  int ctx_id;
  int tagreq;
  int rwritereq;
  char str_num_blocks [33];
  char local_638 [8];
  char str_forced [33];
  char local_608 [8];
  char str_ctx_id [33];
  char local_5d8 [8];
  char str_tagreq [33];
  char local_5a8 [8];
  char str_rwritereq [33];
  int hpi;
  int stuff_3;
  int rca_2;
  char str_hpi [33];
  char local_548 [8];
  char str_stuff_3 [33];
  char local_518 [8];
  char str_rca_2 [33];
  int cmd;
  int value;
  int index;
  int access;
  char str_cmd2 [33];
  char local_4a8 [8];
  char str_value [33];
  char local_478 [8];
  char str_index [33];
  char local_448 [8];
  char str_access [33];
  int stuff_2;
  int sleepawake;
  int rca_1;
  char str_stuff_2 [33];
  char local_3e8 [8];
  char str_sleepawake [33];
  char local_3b8 [8];
  char str_rca_1 [33];
  int stuff_1;
  int dsr;
  char str_stuff_1 [33];
  char local_358 [8];
  char str_dsr [33];
  int stuff;
  int rca;
  char str_stuff [33];
  char local_2f8 [8];
  char str_rca [33];
  char local_2c8 [8];
  char str_buf [512];
  char *str_desc;
  char str_arg [33];
  char local_88 [8];
  char str_cmd [33];
  Frame local_50 [8];
  Frame frame;
  byte local_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  uint uStack_3c;
  byte local_38;
  byte bStack_37;
  byte bStack_36;
  byte bStack_35;
  undefined2 uStack_34;
  byte bStack_32;
  undefined1 uStack_31;
  undefined1 local_30;
  undefined1 local_2f;
  DisplayBase display_base_local;
  Channel *channel_local;
  U64 frame_index_local;
  SDMMCAnalyzerResults *this_local;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_50);
  switch(local_30) {
  case 0:
    bVar1 = Channel::operator!=(channel,&this->mSettings->mCommandChannel);
    if ((bVar1 & 1) == 0) {
      if (CONCAT44(uStack_3c,CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40))))
          == 1) {
        AnalyzerResults::AddResultString
                  ((char *)this,"Host sending",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      }
      else {
        AnalyzerResults::AddResultString
                  ((char *)this,"Card sending",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      }
    }
    break;
  case 1:
    bVar1 = Channel::operator!=(channel,&this->mSettings->mCommandChannel);
    if ((bVar1 & 1) != 0) break;
    AnalyzerHelpers::GetNumberString
              (CONCAT44(uStack_3c,
                        CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40)))),
               Decimal,6,local_88,0x21);
    AnalyzerHelpers::GetNumberString
              (CONCAT17(uStack_31,
                        CONCAT16(bStack_32,
                                 CONCAT24(uStack_34,
                                          CONCAT13(bStack_35,
                                                   CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)))
                                         ))),display_base,0x20,(char *)&str_desc,0x21);
    SDMMCHelpers::MMCCommandDescription
              (CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40))),
               CONCAT13(bStack_35,CONCAT12(bStack_36,CONCAT11(bStack_37,local_38))));
    AnalyzerResults::AddResultString
              ((char *)this,"CMD",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"CMD",local_88,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"CMD",local_88,", arg=",(char *)&str_desc,"  ");
    pcVar3 = cmd_abbrev_from_number
                       (CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40))));
    ppcVar5 = &str_desc;
    AnalyzerResults::AddResultString((char *)this,"CMD",local_88," (",pcVar3,"), arg=");
    switch(CONCAT44(uStack_3c,CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40)))))
    {
    case 3:
    case 7:
    case 9:
    case 10:
    case 0xf:
    case 0x37:
      register0x00000000 = (uint)local_38;
      AnalyzerHelpers::GetNumberString((long)(int)(uint)bStack_36,display_base,0x20,local_2f8,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)stack0xfffffffffffffcd0,display_base,0x20,(char *)&stuff,0x21);
      sprintf(local_2c8,", arg=%s, rca=%s, stuff=%s",&str_desc,local_2f8,&stuff);
      break;
    case 4:
      register0x00000000 = (uint)local_38;
      AnalyzerHelpers::GetNumberString((long)(int)(uint)bStack_36,display_base,0x20,local_358,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)stack0xfffffffffffffc70,display_base,0x20,(char *)&stuff_1,0x21);
      sprintf(local_2c8,", arg=%s, dsr=%s, stuff=%s",&str_desc,local_358,&stuff_1);
      break;
    case 5:
      register0x00000000 = (CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)) & 0x78000) >> 0xf;
      str_access._28_4_ = ZEXT14(local_38);
      AnalyzerHelpers::GetNumberString((long)(int)(uint)bStack_36,display_base,0x20,local_3b8,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)stack0xfffffffffffffbe0,display_base,4,local_3e8,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)str_access._28_4_,display_base,0x20,(char *)&sleepawake,0x21);
      sprintf(local_2c8,", arg=%s, rca=%s, sleepawake=%s, stuff=%s",&str_desc,local_3b8,local_3e8,
              &sleepawake,ppcVar5);
      break;
    case 6:
      AnalyzerHelpers::GetNumberString((long)(int)(bStack_35 & 0xf),display_base,4,local_448,0x21);
      AnalyzerHelpers::GetNumberString((long)(int)(uint)bStack_36,display_base,0x20,local_478,0x21);
      AnalyzerHelpers::GetNumberString((long)(int)(uint)bStack_37,display_base,0x20,local_4a8,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)(CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)) & 0xf),display_base,4,
                 (char *)&index,0x21);
      sprintf(local_2c8,", arg=%s, access=%s, index=%s, value=%s, cmd=%s",&str_desc,local_448,
              local_478,local_4a8,&index);
      AnalyzerResults::AddResultString
                ((char *)this,"CMD",local_88,local_2c8,(char *)0x0,(char *)0x0);
      break;
    case 0xc:
    case 0xd:
      register0x00000000 = (CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)) & 0x1fe) >> 1;
      str_rwritereq._28_4_ = CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)) & 0xf;
      AnalyzerHelpers::GetNumberString((long)(int)(uint)bStack_36,display_base,0x20,local_518,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)stack0xfffffffffffffa80,display_base,0x20,local_548,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)str_rwritereq._28_4_,display_base,4,(char *)&stuff_3,0x21);
      sprintf(local_2c8,", arg=%s, rca=%s, stuff=%s, hpi=%s",&str_desc,local_518,local_548,&stuff_3,
              ppcVar5);
      break;
    case 0x17:
      uVar2 = CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)) & 0xff;
      if ((((CONCAT21(uStack_34,bStack_35) & 0x780) == 0) &&
          (((uint)(CONCAT14(uStack_31,CONCAT13(bStack_32,CONCAT21(uStack_34,bStack_35))) >> 6) & 0xf
           ) == 1)) && (bStack_36 == 0)) {
        AnalyzerHelpers::GetNumberString
                  ((long)(int)(CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)) & 0xff),display_base
                   ,0x20,(char *)&tagreq,0x21);
        sprintf(local_2c8,", arg=%s, num_blocks=%s",&str_desc,&tagreq);
      }
      else {
        AnalyzerHelpers::GetNumberString
                  ((long)(int)((uint)(CONCAT14(uStack_31,
                                               CONCAT13(bStack_32,CONCAT21(uStack_34,bStack_35))) >>
                                     7) & 0xf),display_base,4,local_5a8,0x21);
        AnalyzerHelpers::GetNumberString
                  ((long)(int)((uint)(CONCAT14(uStack_31,
                                               CONCAT13(bStack_32,CONCAT21(uStack_34,bStack_35))) >>
                                     5) & 0xf),display_base,0x20,local_5d8,0x21);
        AnalyzerHelpers::GetNumberString
                  ((long)(int)((uint)(CONCAT14(uStack_31,
                                               CONCAT13(bStack_32,CONCAT21(uStack_34,bStack_35))) >>
                                     1) & 0xff),display_base,0x20,local_608,0x21);
        AnalyzerHelpers::GetNumberString
                  ((long)(int)(CONCAT21(uStack_34,bStack_35) & 0xf),display_base,4,local_638,0x21);
        AnalyzerHelpers::GetNumberString((long)(int)uVar2,display_base,4,(char *)&tagreq,0x21);
        sprintf(local_2c8,", arg=%s, rwritereq=%s, tagreq=%s, ctx_id=%s, forced=%s, num_blocks=%s",
                &str_desc,local_5a8,local_5d8,local_608,local_638,uVar2);
      }
      break;
    case 0x26:
      AnalyzerHelpers::GetNumberString
                ((long)(int)((uint)(CONCAT14(uStack_31,
                                             CONCAT13(bStack_32,CONCAT21(uStack_34,bStack_35))) >> 7
                                   ) & 0xf),display_base,4,local_6b8,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)((CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)) & 0x78000) >> 0xf),
                 display_base,4,local_6e8,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)((CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)) & 0x1e) >> 1),
                 display_base,4,local_718,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)(CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)) & 0xf),display_base,4,
                 (char *)&forcegarb,0x21);
      sprintf(local_2c8,
              ", arg=%s, securereq=%s, forcegarbage=%s, discard_en=%s, ident_writeblocks=%s",
              &str_desc,local_6b8,local_6e8,local_718,&forcegarb);
      break;
    case 0x27:
      AnalyzerHelpers::GetNumberString((long)(int)(uint)bStack_36,display_base,0x20,local_788,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)((CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)) & 0x78000) >> 0xf),
                 display_base,4,local_7b8,0x21);
      AnalyzerHelpers::GetNumberString((long)(int)(uint)bStack_37,display_base,0x20,local_7e8,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)(uint)local_38,display_base,0x20,(char *)&reg_wflag,0x21);
      sprintf(local_2c8,", arg=%s, rca=%s, reg_wflag=%s, reg_addr=%s, reg_data=%s",&str_desc,
              local_788,local_7b8,local_7e8,&reg_wflag);
      break;
    case 0x35:
    case 0x36:
      register0x00000000 = (uint)bStack_37;
      str_stuff_4._28_4_ = ZEXT14(local_38);
      AnalyzerHelpers::GetNumberString((long)(int)(uint)bStack_36,display_base,0x20,local_858,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)stack0xfffffffffffff740,display_base,0x20,local_888,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)str_stuff_4._28_4_,display_base,0x20,(char *)&sec_prot,0x21);
      sprintf(local_2c8,", arg=%s, sec_specific=%s, sec_protocol=%s, reserv=%s",&str_desc,local_858,
              local_888,&sec_prot,ppcVar5);
      break;
    case 0x38:
      register0x00000000 = CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)) & 0xf;
      AnalyzerHelpers::GetNumberString
                ((long)(int)((CONCAT12(bStack_36,CONCAT11(bStack_37,local_38)) & 0x1fe) >> 1),
                 display_base,0x20,local_8e8,0x21);
      AnalyzerHelpers::GetNumberString
                ((long)(int)stack0xfffffffffffff6e0,display_base,4,(char *)&rd_wr,0x21);
      sprintf(local_2c8,", arg=%s, stuff=%s, rd_wr1=%s",&str_desc,local_8e8,&rd_wr);
    }
  case 2:
    bVar1 = Channel::operator!=(channel,&this->mSettings->mCommandChannel);
    if ((bVar1 & 1) == 0) {
      switch(local_2f) {
      case 1:
        local_950 = "reserved";
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_970,"",&local_971);
        std::allocator<char>::~allocator((allocator<char> *)&local_971);
        switch((CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40)) & 0x1e00) >> 9) {
        case 0:
          local_950 = "Idle";
          break;
        case 1:
          local_950 = "Ready";
          break;
        case 2:
          local_950 = "Ident";
          break;
        case 3:
          local_950 = "Stby";
          break;
        case 4:
          local_950 = "Tran";
          break;
        case 5:
          local_950 = "Data";
          break;
        case 6:
          local_950 = "Rcv";
          break;
        case 7:
          local_950 = "Prg";
          break;
        case 8:
          local_950 = "Dis";
          break;
        case 9:
          local_950 = "Btst";
          break;
        case 10:
          local_950 = "Slp ";
        }
        AnalyzerHelpers::GetNumberString
                  (CONCAT44(uStack_3c,
                            CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40)))),
                   display_base,0x20,(char *)&str_state,0x21);
        AnalyzerResults::AddResultString
                  ((char *)this,"R1",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        AnalyzerResults::AddResultString
                  ((char *)this,"R1, ",local_950,(char *)0x0,(char *)0x0,(char *)0x0);
        AnalyzerResults::AddResultString
                  ((char *)this,"R1, ",local_950,", rsp=",(char *)&str_state,(char *)0x0);
        if ((CONCAT41(uStack_3c,bStack_3d) & 0xffffffff80) != 0) {
          std::__cxx11::string::operator+=(local_970," ADDRESS_OUT_OF_RANGE");
        }
        if ((bStack_3d & 0x40) != 0) {
          std::__cxx11::string::operator+=(local_970," ADDRESS_MISALIGN");
        }
        if ((bStack_3d & 0x20) != 0) {
          std::__cxx11::string::operator+=(local_970," BLOCK_LEN_ERROR");
        }
        if ((bStack_3d & 0x10) != 0) {
          std::__cxx11::string::operator+=(local_970," ERASE_SEQ_ERROR");
        }
        if ((bStack_3d & 8) != 0) {
          std::__cxx11::string::operator+=(local_970," ERASE_PARAM");
        }
        if ((bStack_3d & 4) != 0) {
          std::__cxx11::string::operator+=(local_970," WP_VIOLATION");
        }
        if ((bStack_3d & 2) != 0) {
          std::__cxx11::string::operator+=(local_970," CARD_IS_LOCKED");
        }
        if ((bStack_3d & 1) != 0) {
          std::__cxx11::string::operator+=(local_970," LOCK_UNLOCK_FAILED");
        }
        if ((bStack_3e & 0x80) != 0) {
          std::__cxx11::string::operator+=(local_970," COM_CRC_ERROR");
        }
        if ((bStack_3e & 0x40) != 0) {
          std::__cxx11::string::operator+=(local_970," ILLEGAL_COMMAND");
        }
        if ((bStack_3e & 0x20) != 0) {
          std::__cxx11::string::operator+=(local_970," CARD_ECC_FAILED");
        }
        if ((bStack_3e & 0x10) != 0) {
          std::__cxx11::string::operator+=(local_970," CC_ERROR");
        }
        if ((bStack_3e & 8) != 0) {
          std::__cxx11::string::operator+=(local_970," ERROR");
        }
        if ((bStack_3e & 4) != 0) {
          std::__cxx11::string::operator+=(local_970," UNDERRUN");
        }
        if ((bStack_3e & 2) != 0) {
          std::__cxx11::string::operator+=(local_970," OVERRUN");
        }
        if ((bStack_3e & 1) != 0) {
          std::__cxx11::string::operator+=(local_970," CID/CSD_OVERWRITE");
        }
        if ((bStack_3f & 0x80) != 0) {
          std::__cxx11::string::operator+=(local_970," WP_ERASE_SKIP");
        }
        if ((bStack_3f & 0x20) != 0) {
          std::__cxx11::string::operator+=(local_970," ERASE_RESET");
        }
        if ((bStack_3f & 1) != 0) {
          std::__cxx11::string::operator+=(local_970," READY_FOR_DATA");
        }
        if ((local_40 & 0x80) != 0) {
          std::__cxx11::string::operator+=(local_970," SWITCH_ERROR");
        }
        if ((local_40 & 0x40) != 0) {
          std::__cxx11::string::operator+=(local_970," EXCEPTION_EVENT");
        }
        if ((local_40 & 0x20) != 0) {
          std::__cxx11::string::operator+=(local_970," APP_CMD");
        }
        if ((local_40 & 0x10) != 0) {
          std::__cxx11::string::operator+=(local_970," RESERVED");
        }
        if (((local_40 & 8) != 0) || ((local_40 & 4) != 0)) {
          std::__cxx11::string::operator+=(local_970," APP_SPECIFIC");
        }
        if (((local_40 & 2) != 0) || ((local_40 & 1) != 0)) {
          std::__cxx11::string::operator+=(local_970," MANUF_TEST");
        }
        lVar4 = std::__cxx11::string::length();
        if (lVar4 != 0) {
          pcVar3 = (char *)std::__cxx11::string::c_str();
          AnalyzerResults::AddResultString
                    ((char *)this,"R1, ",local_950,", rsp=",(char *)&str_state,pcVar3);
        }
        std::__cxx11::string::~string(local_970);
        break;
      case 2:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)pname,"R2",(allocator *)(prv_str + 3));
        std::allocator<char>::~allocator((allocator<char> *)(prv_str + 3));
        pcVar3 = (char *)std::__cxx11::string::c_str();
        AnalyzerResults::AddResultString
                  ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        std::__cxx11::string::operator+=((string *)pname," [CID]");
        pcVar3 = (char *)std::__cxx11::string::c_str();
        AnalyzerResults::AddResultString
                  ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        std::__cxx11::string::operator+=((string *)pname," rsp=");
        AnalyzerHelpers::GetNumberString((ulong)uStack_3c,display_base,0x20,(char *)&psn,0x40);
        std::__cxx11::string::operator+=((string *)pname,(char *)&psn);
        std::__cxx11::string::operator+=((string *)pname," ");
        AnalyzerHelpers::GetNumberString
                  ((ulong)CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40))),
                   display_base,0x20,(char *)&psn,0x40);
        std::__cxx11::string::operator+=((string *)pname,(char *)&psn);
        std::__cxx11::string::operator+=((string *)pname," ");
        AnalyzerHelpers::GetNumberString
                  ((ulong)CONCAT13(uStack_31,CONCAT12(bStack_32,uStack_34)),display_base,0x20,
                   (char *)&psn,0x40);
        std::__cxx11::string::operator+=((string *)pname,(char *)&psn);
        std::__cxx11::string::operator+=((string *)pname," ");
        AnalyzerHelpers::GetNumberString
                  ((ulong)CONCAT13(bStack_35,CONCAT12(bStack_36,CONCAT11(bStack_37,local_38))),
                   display_base,0x20,(char *)&psn,0x40);
        std::__cxx11::string::operator+=((string *)pname,(char *)&psn);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        AnalyzerResults::AddResultString
                  ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        psn_str[8] = (char)uStack_3c;
        prv_str[2] = '\0';
        psn_str[4] = bStack_32 >> 4 | 0x30;
        psn_str[5] = '.';
        psn_str[6] = bStack_32 & 0xf | 0x30;
        psn_str[7] = '\0';
        AnalyzerHelpers::GetNumberString
                  ((ulong)CONCAT22(uStack_34,CONCAT11(bStack_35,bStack_36)),Decimal,0x20,local_9b0,
                   0xc);
        std::__cxx11::string::operator+=((string *)pname," pnm=\'");
        std::__cxx11::string::operator+=((string *)pname,psn_str + 8);
        std::__cxx11::string::operator+=((string *)pname,"\' prv=");
        std::__cxx11::string::operator+=((string *)pname,psn_str + 4);
        std::__cxx11::string::operator+=((string *)pname," psn=");
        std::__cxx11::string::operator+=((string *)pname,local_9b0);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        AnalyzerResults::AddResultString
                  ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        std::__cxx11::string::~string((string *)pname);
        break;
      case 3:
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a20,"R2",(allocator *)(rsp_str_1 + 0x3f));
        std::allocator<char>::~allocator((allocator<char> *)(rsp_str_1 + 0x3f));
        pcVar3 = (char *)std::__cxx11::string::c_str();
        AnalyzerResults::AddResultString
                  ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        std::__cxx11::string::operator+=(local_a20," [CSD]");
        pcVar3 = (char *)std::__cxx11::string::c_str();
        AnalyzerResults::AddResultString
                  ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        std::__cxx11::string::operator+=(local_a20," rsp=");
        AnalyzerHelpers::GetNumberString((ulong)uStack_3c,display_base,0x20,str_crc,0x40);
        std::__cxx11::string::operator+=(local_a20,str_crc);
        std::__cxx11::string::operator+=(local_a20," ");
        AnalyzerHelpers::GetNumberString
                  ((ulong)CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40))),
                   display_base,0x20,str_crc,0x40);
        std::__cxx11::string::operator+=(local_a20,str_crc);
        std::__cxx11::string::operator+=(local_a20," ");
        AnalyzerHelpers::GetNumberString
                  ((ulong)CONCAT13(uStack_31,CONCAT12(bStack_32,uStack_34)),display_base,0x20,
                   str_crc,0x40);
        std::__cxx11::string::operator+=(local_a20,str_crc);
        std::__cxx11::string::operator+=(local_a20," ");
        AnalyzerHelpers::GetNumberString
                  ((ulong)CONCAT13(bStack_35,CONCAT12(bStack_36,CONCAT11(bStack_37,local_38))),
                   display_base,0x20,str_crc,0x40);
        std::__cxx11::string::operator+=(local_a20,str_crc);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        AnalyzerResults::AddResultString
                  ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        std::__cxx11::string::~string(local_a20);
        break;
      case 4:
        AnalyzerHelpers::GetNumberString
                  (CONCAT44(uStack_3c,
                            CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40)))),
                   Hexadecimal,0x20,(char *)&str_state,0x21);
        AnalyzerResults::AddResultString
                  ((char *)this,"R3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        AnalyzerResults::AddResultString
                  ((char *)this,"R3, ocr=",(char *)&str_state,(char *)0x0,(char *)0x0,(char *)0x0);
        break;
      case 5:
        AnalyzerResults::AddResultString
                  ((char *)this,"R4",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        break;
      case 6:
        AnalyzerResults::AddResultString
                  ((char *)this,"R5",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      }
    }
    break;
  case 3:
    bVar1 = Channel::operator!=(channel,&this->mSettings->mCommandChannel);
    if ((bVar1 & 1) == 0) {
      AnalyzerHelpers::GetNumberString
                (CONCAT44(uStack_3c,
                          CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40)))),
                 Hexadecimal,7,str_crc_1,8);
      AnalyzerResults::AddResultString
                ((char *)this,"CRC",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"CRC=",str_crc_1,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    break;
  case 4:
    bVar1 = Channel::operator!=(channel,&this->mSettings->mDataChannel0);
    if ((bVar1 & 1) == 0) {
      AnalyzerHelpers::GetNumberString
                (CONCAT44(uStack_3c,
                          CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40)))),
                 Hexadecimal,8,str_crc_2,8);
      AnalyzerResults::AddResultString
                ((char *)this,str_crc_2,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    break;
  case 5:
    bVar1 = Channel::operator!=(channel,&this->mSettings->mDataChannel0);
    if ((bVar1 & 1) == 0) {
      AnalyzerHelpers::GetNumberString
                (CONCAT44(uStack_3c,
                          CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40)))),
                 Hexadecimal,8,local_a80,8);
      AnalyzerResults::AddResultString
                ((char *)this,local_a80,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    break;
  case 6:
    bVar1 = Channel::operator!=(channel,&this->mSettings->mDataChannel0);
    if ((bVar1 & 1) == 0) {
      if (CONCAT44(uStack_3c,CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40))))
          == 5) {
        AnalyzerResults::AddResultString
                  ((char *)this,"BAD CRC",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      }
      else if (CONCAT44(uStack_3c,
                        CONCAT13(bStack_3d,CONCAT12(bStack_3e,CONCAT11(bStack_3f,local_40)))) == 2)
      {
        AnalyzerResults::AddResultString
                  ((char *)this,"GOOD CRC",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      }
      else {
        AnalyzerResults::AddResultString
                  ((char *)this,"UNEXPECTED CRC",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      }
    }
    break;
  default:
    AnalyzerResults::AddResultString
              ((char *)this,"error",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  Frame::~Frame(local_50);
  return;
}

Assistant:

void SDMMCAnalyzerResults::GenerateBubbleText(U64 frame_index, Channel& channel, DisplayBase display_base)
{
	ClearResultStrings();
	Frame frame = GetFrame(frame_index);

	switch (frame.mType) {
	case FRAMETYPE_HEADER:
		if (channel != mSettings->mCommandChannel)
			break;
		if (frame.mData1 == 1)
			AddResultString("Host sending");
		else
			AddResultString("Card sending");
		break;

case FRAMETYPE_COMMAND:
	{
		if (channel != mSettings->mCommandChannel)
			break;
		char str_cmd[33];
		char str_arg[33];
		const char *str_desc;
		char str_buf[512];

		AnalyzerHelpers::GetNumberString(frame.mData1, Decimal, 6, str_cmd, sizeof(str_cmd));
		AnalyzerHelpers::GetNumberString(frame.mData2, display_base, 32, str_arg, sizeof(str_arg));

		str_desc = SDMMCHelpers::MMCCommandDescription(frame.mData1, frame.mData2);

		AddResultString("CMD");
		AddResultString("CMD", str_cmd);
		AddResultString("CMD", str_cmd, ", arg=", str_arg, "  ", str_desc);
		AddResultString("CMD", str_cmd, " (", cmd_abbrev_from_number(frame.mData1), "), arg=", str_arg);

		switch (frame.mData1) {
		case 3: //SET_RELATIVE_ADDR
		case 7: //SELECT/DESELECT_CARD
		case 9: //SEND_CSD
		case 10: //SEND_CID
		case 15: //GO_INACTIVE_STATE
		case 55: //APP_CMD
        {
			char str_rca[33];
			char str_stuff[33];

			int rca = (frame.mData2 >> 16) & 0xFF;			//[31:16] RCA
			int stuff = frame.mData2 & 0xFF;				//[15:0] stuff bits

			AnalyzerHelpers::GetNumberString(rca, display_base, 32, str_rca, sizeof(str_rca));
			AnalyzerHelpers::GetNumberString(stuff, display_base, 32, str_stuff, sizeof(str_stuff));

			sprintf(str_buf, ", arg=%s, rca=%s, stuff=%s", str_arg, str_rca, str_stuff);
			break;
        }
		case 4: //SET_DSR
            {
			char str_dsr[33];
			char str_stuff[33];

			int dsr = (frame.mData2 >> 16) & 0xFF;			//[31:16] DSR
			int stuff = frame.mData2 & 0xFF;				//[15:0] stuff bits

			AnalyzerHelpers::GetNumberString(dsr, display_base, 32, str_dsr, sizeof(str_dsr));
			AnalyzerHelpers::GetNumberString(stuff, display_base, 32, str_stuff, sizeof(str_stuff));

			sprintf(str_buf, ", arg=%s, dsr=%s, stuff=%s", str_arg, str_dsr, str_stuff);
			break;}
		case 5: //SLEEP_AWAKE
            {
			char str_rca[33];
			char str_sleepawake[33];
			char str_stuff[33];

			int rca = (frame.mData2 >> 16) & 0xFF;			//[31:16] RCA
			int sleepawake = (frame.mData2 >> 15) & 0xF;	//[15]Sleep/Awake
			int stuff = frame.mData2 & 0xFF;				//[14:0] stuff bits

			AnalyzerHelpers::GetNumberString(rca, display_base, 32, str_rca, sizeof(str_rca));
			AnalyzerHelpers::GetNumberString(sleepawake, display_base, 4, str_sleepawake, sizeof(str_sleepawake));
			AnalyzerHelpers::GetNumberString(stuff, display_base, 32, str_stuff, sizeof(str_stuff));

			sprintf(str_buf, ", arg=%s, rca=%s, sleepawake=%s, stuff=%s", str_arg, str_rca, str_sleepawake, str_stuff);
			break;}
		case 6: //SWITCH
            {
			char str_access[33];
			char str_index[33];
			char str_value[33];
			char str_cmd2[33];

			int access = (frame.mData2 >> 24) & 0xF;   		//[25:24] Access 0=cmd_set 1=set_bits 2=clear_bits 3=write_byte
			int index = (frame.mData2 >> 16) & 0xFF; 		//[23:16] Index
			int value = (frame.mData2 >> 8) & 0xFF;  		//[15:8] Value
			int cmd = frame.mData2 & 0xF;              		//[2:0] Cmd Set

			AnalyzerHelpers::GetNumberString(access, display_base, 4, str_access, sizeof(str_access));
			AnalyzerHelpers::GetNumberString(index, display_base, 32, str_index, sizeof(str_index));
			AnalyzerHelpers::GetNumberString(value, display_base, 32, str_value, sizeof(str_value));
			AnalyzerHelpers::GetNumberString(cmd, display_base, 4, str_cmd2, sizeof(str_cmd2));

			sprintf(str_buf, ", arg=%s, access=%s, index=%s, value=%s, cmd=%s", str_arg, str_access, str_index, str_value, str_cmd2);

			AddResultString("CMD", str_cmd, str_buf);
			break;}
		case 12: //STOP_TRANSMISSION
		case 13: //SEND_STATUS
            {
			char str_rca[33];
			char str_stuff[33];
			char str_hpi[33];

			int rca = (frame.mData2 >> 16) & 0xFF;	//[31:16] RCA
			int stuff = (frame.mData2 >> 1) & 0xFF; //[15:1] stuff bits
			int hpi = frame.mData2 & 0xF;			//[0] HPI

			AnalyzerHelpers::GetNumberString(rca, display_base, 32, str_rca, sizeof(str_rca));
			AnalyzerHelpers::GetNumberString(stuff, display_base, 32, str_stuff, sizeof(str_stuff));
			AnalyzerHelpers::GetNumberString(hpi, display_base, 4, str_hpi, sizeof(str_hpi));

			sprintf(str_buf, ", arg=%s, rca=%s, stuff=%s, hpi=%s", str_arg, str_rca, str_stuff, str_hpi);
			break;}
		case 23: //SET_BLOCK_COUNT
            {
			char str_rwritereq[33];
			char str_tagreq[33];
			char str_ctx_id[33];
			char str_forced[33];
			char str_num_blocks[33];

		// default
			int rwritereq = (frame.mData2 >> 31) & 0xF;	//[31] Reliable Write Request
														//[30] ‘0’ non- packed
			int tagreq = (frame.mData2 >> 29) & 0xF;	//[29] tag request
			int ctx_id = (frame.mData2 >> 25) & 0xFF;	//[28:25] context ID
			int forced = (frame.mData2 >> 24) & 0xF;	//[24]: forced programming
														//[23:16] set to 0
			int num_blocks = frame.mData2 & 0xFF;		//[15:0] number of blocks
		// packed
			int p_zero = (frame.mData2 >> 31) & 0xF;	//[31] set to 0
			int p_one = (frame.mData2 >> 30) & 0xF;		//[30] ‘1’ packed
			int p_zero2 = (frame.mData2 >> 16) & 0xFF;	//[29:16] set to 0
			int num_blocks2 = frame.mData2 & 0xFF;		//[15:0] number of blocks

			if (p_zero == 0 && p_one == 1 && p_zero2 == 0) { // seems packed
				AnalyzerHelpers::GetNumberString(num_blocks2, display_base, 32, str_num_blocks, sizeof(str_num_blocks));

				sprintf(str_buf, ", arg=%s, num_blocks=%s", str_arg, str_num_blocks);

			} else { // has to be default then
				AnalyzerHelpers::GetNumberString(rwritereq, display_base, 4, str_rwritereq, sizeof(str_rwritereq));
				AnalyzerHelpers::GetNumberString(tagreq, display_base, 32, str_tagreq, sizeof(str_tagreq));
				AnalyzerHelpers::GetNumberString(ctx_id, display_base, 32, str_ctx_id, sizeof(str_ctx_id));
				AnalyzerHelpers::GetNumberString(forced, display_base, 4, str_forced, sizeof(str_forced));
				AnalyzerHelpers::GetNumberString(num_blocks, display_base, 4, str_num_blocks, sizeof(str_num_blocks));

				sprintf(str_buf, ", arg=%s, rwritereq=%s, tagreq=%s, ctx_id=%s, forced=%s, num_blocks=%s", str_arg, str_rwritereq, str_tagreq, str_ctx_id, str_forced, num_blocks);
			}
			break;}
		case 38: //ERASE
            {
			char str_securereq[33];
			char str_forcegarb[33];
			char str_discard_en[33];
			char str_ident_writeblocks[33];

			int securereq = (frame.mData2 >> 31) & 0xF;	//[31] Secure request
			//[30:16] set to 0
			int forcegarb = (frame.mData2 >> 15) & 0xF;	//[15] Force Garbage Collect request
			//[14:2] set to 0
			int discard_en = (frame.mData2 >> 1) & 0xF;	//[1] Discard Enable
			int ident_writeblocks = frame.mData2 & 0xF;	//[0] Identify Write Blocks for Erase (or TRIM Enable)

			AnalyzerHelpers::GetNumberString(securereq, display_base, 4, str_securereq, sizeof(str_securereq));
			AnalyzerHelpers::GetNumberString(forcegarb, display_base, 4, str_forcegarb, sizeof(str_forcegarb));
			AnalyzerHelpers::GetNumberString(discard_en, display_base, 4, str_discard_en, sizeof(str_discard_en));
			AnalyzerHelpers::GetNumberString(ident_writeblocks, display_base, 4, str_ident_writeblocks, sizeof(str_ident_writeblocks));

			sprintf(str_buf, ", arg=%s, securereq=%s, forcegarbage=%s, discard_en=%s, ident_writeblocks=%s", str_arg, str_securereq, str_forcegarb, str_discard_en, str_ident_writeblocks);
			break;}
		case 39: //FAST_IO
            {
			char str_rca[33];
			char str_reg_wflag[33];
			char str_reg_addr[33];
			char str_reg_data[33];

			int rca = (frame.mData2 >> 16) & 0xFF;		//[31:16] RCA
			int reg_wflag = (frame.mData2 >> 15) & 0xF;	//[15:15] register write flag
			int reg_addr = (frame.mData2 >> 8) & 0xFF;	//[14:8] register address
			int reg_data = frame.mData2 & 0xFF;			//[7:0] register data

			AnalyzerHelpers::GetNumberString(rca, display_base, 32, str_rca, sizeof(str_rca));
			AnalyzerHelpers::GetNumberString(reg_wflag, display_base, 4, str_reg_wflag, sizeof(str_reg_wflag));
			AnalyzerHelpers::GetNumberString(reg_addr, display_base, 32, str_reg_addr, sizeof(str_reg_addr));
			AnalyzerHelpers::GetNumberString(reg_data, display_base, 32, str_reg_data, sizeof(str_reg_data));

			sprintf(str_buf, ", arg=%s, rca=%s, reg_wflag=%s, reg_addr=%s, reg_data=%s", str_arg, str_rca, str_reg_wflag, str_reg_addr, str_reg_data);
			break;}
		case 53: //PROTOCOL_RD
		case 54: //PROTOCOL_WR
            {
			char str_sec_spec[33];
			char str_sec_prot[33];
			char str_reserv[33];

			int sec_spec = (frame.mData2 >> 16) & 0xFF;	//[16:31] Security Protocol Specific
			int sec_prot = (frame.mData2 >> 8) & 0xFF;	//[15:8] Security Protocol
			int reserv = frame.mData2 & 0xFF;			//[7:0] reserved

			AnalyzerHelpers::GetNumberString(sec_spec, display_base, 32, str_sec_spec, sizeof(str_sec_spec));
			AnalyzerHelpers::GetNumberString(sec_prot, display_base, 32, str_sec_prot, sizeof(str_sec_prot));
			AnalyzerHelpers::GetNumberString(reserv, display_base, 32, str_reserv, sizeof(str_reserv));

			sprintf(str_buf, ", arg=%s, sec_specific=%s, sec_protocol=%s, reserv=%s", str_arg, str_sec_spec, str_sec_prot, str_reserv);
			break;}
		case 56: //GEN_CMD
            {
			char str_stuff[33];
			char str_rd_wr[33];

			int stuff = (frame.mData2 >> 1) & 0xFF;	//[31:1] stuff bits.
			int rd_wr = frame.mData2 & 0xF;			//[0]: RD/WR1

			AnalyzerHelpers::GetNumberString(stuff, display_base, 32, str_stuff, sizeof(str_stuff));
			AnalyzerHelpers::GetNumberString(rd_wr, display_base, 4, str_rd_wr, sizeof(str_rd_wr));

			sprintf(str_buf, ", arg=%s, stuff=%s, rd_wr1=%s", str_arg, str_stuff, str_rd_wr);
			break;}
		}
	}

	case FRAMETYPE_RESPONSE:
	{
		if (channel != mSettings->mCommandChannel)
			break;
		char str_32[33];

		switch (frame.mFlags) {
		case MMC_RSP_R1:
		{
			const char *str_state = "reserved";
			std::string str_flags("");

			switch ((frame.mData1 >> 9) & 0xf) {
			case 0: str_state = "Idle"; break;
			case 1: str_state = "Ready"; break;
			case 2: str_state = "Ident"; break;
			case 3: str_state = "Stby"; break;
			case 4: str_state = "Tran"; break;
			case 5: str_state = "Data"; break;
			case 6: str_state = "Rcv"; break;
			case 7: str_state = "Prg"; break;
			case 8: str_state = "Dis"; break;
			case 9: str_state = "Btst"; break;
			case 10: str_state = "Slp "; break;
			}

			AnalyzerHelpers::GetNumberString(frame.mData1, display_base, 32, str_32, sizeof(str_32));

			AddResultString("R1");
			AddResultString("R1, ", str_state);
			AddResultString("R1, ", str_state, ", rsp=", str_32);

			if (frame.mData1 & (1 << 31))
					str_flags += " ADDRESS_OUT_OF_RANGE";
			if (frame.mData1 & (1 << 30))
					str_flags += " ADDRESS_MISALIGN";
			if (frame.mData1 & (1 << 29))
					str_flags += " BLOCK_LEN_ERROR";
			if (frame.mData1 & (1 << 28))
					str_flags += " ERASE_SEQ_ERROR";
			if (frame.mData1 & (1 << 27))
					str_flags += " ERASE_PARAM";
			if (frame.mData1 & (1 << 26))
					str_flags += " WP_VIOLATION";
			if (frame.mData1 & (1 << 25))
					str_flags += " CARD_IS_LOCKED";
			if (frame.mData1 & (1 << 24))
					str_flags += " LOCK_UNLOCK_FAILED";
			if (frame.mData1 & (1 << 23))
					str_flags += " COM_CRC_ERROR";
			if (frame.mData1 & (1 << 22))
					str_flags += " ILLEGAL_COMMAND";
			if (frame.mData1 & (1 << 21))
					str_flags += " CARD_ECC_FAILED";
			if (frame.mData1 & (1 << 20))
					str_flags += " CC_ERROR";
			if (frame.mData1 & (1 << 19))
					str_flags += " ERROR";
			if (frame.mData1 & (1 << 18))
					str_flags += " UNDERRUN";
			if (frame.mData1 & (1 << 17))
					str_flags += " OVERRUN";
			if (frame.mData1 & (1 << 16))
					str_flags += " CID/CSD_OVERWRITE";
			if (frame.mData1 & (1 << 15))
					str_flags += " WP_ERASE_SKIP";
			if (frame.mData1 & (1 << 13))
					str_flags += " ERASE_RESET";
			if (frame.mData1 & (1 << 8))
					str_flags += " READY_FOR_DATA";
			if (frame.mData1 & (1 << 7))
					str_flags += " SWITCH_ERROR";
			if (frame.mData1 & (1 << 6))
					str_flags += " EXCEPTION_EVENT";
			if (frame.mData1 & (1 << 5))
					str_flags += " APP_CMD";
			if (frame.mData1 & (1 << 4))
					str_flags += " RESERVED";
			if (frame.mData1 & (1 << 3) || frame.mData1 & (1 << 2))
					str_flags += " APP_SPECIFIC";
			if (frame.mData1 & (1 << 1) || frame.mData1 & 1)
					str_flags += " MANUF_TEST";

			if (str_flags.length() > 0)
				AddResultString("R1, ", str_state, ", rsp=", str_32, str_flags.c_str());

			break;
		}
		case MMC_RSP_R2_CID:
		{
			std::string res("R2");
			char pname[7], prv_str[4], psn_str[12];
			char rsp_str[64];

			AddResultString(res.c_str());

			res += " [CID]";
			AddResultString(res.c_str());

			res += " rsp=";
			AnalyzerHelpers::GetNumberString(frame.mData1 >> 32, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			res += " ";
			AnalyzerHelpers::GetNumberString(frame.mData1 & 0xffffffffull, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			res += " ";
			AnalyzerHelpers::GetNumberString(frame.mData2 >> 32, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			res += " ";
			AnalyzerHelpers::GetNumberString(frame.mData2 & 0xffffffffull, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			AddResultString(res.c_str());

			pname[0] = (frame.mData1 >> 32) & 0xff;
			pname[1] = (frame.mData1 >> 24) & 0xff;
			pname[2] = (frame.mData1 >> 16) & 0xff;
			pname[3] = (frame.mData1 >>  8) & 0xff;
			pname[4] = (frame.mData1 >>  0) & 0xff;
			pname[5] = (frame.mData2 >> 56) & 0xff;
			pname[6] = 0;

			unsigned prv = (unsigned)((frame.mData2 >> 48) & 0xff);
			prv_str[0] = '0' + ((prv >> 4) & 0x0f);
			prv_str[1] = '.';
			prv_str[2] = '0' + (prv & 0x0f);
			prv_str[3] = 0;

			unsigned psn = (unsigned)((frame.mData2 >> 16) & 0xfffffffful);
			AnalyzerHelpers::GetNumberString(psn, Decimal, 32, psn_str, sizeof(psn_str));

			res += " pnm='";
			res += pname;
			res += "' prv=";
			res += prv_str;
			res += " psn=";
			res += psn_str;
			AddResultString(res.c_str());

			break;
		}
		case MMC_RSP_R2_CSD:
		{
			std::string res("R2");
			char rsp_str[64];

			AddResultString(res.c_str());

			res += " [CSD]";
			AddResultString(res.c_str());

			res += " rsp=";
			AnalyzerHelpers::GetNumberString(frame.mData1 >> 32, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			res += " ";
			AnalyzerHelpers::GetNumberString(frame.mData1 & 0xffffffffull, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			res += " ";
			AnalyzerHelpers::GetNumberString(frame.mData2 >> 32, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			res += " ";
			AnalyzerHelpers::GetNumberString(frame.mData2 & 0xffffffffull, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			AddResultString(res.c_str());

			break;
		}
		case MMC_RSP_R3:
			AnalyzerHelpers::GetNumberString(frame.mData1, Hexadecimal, 32, str_32, sizeof(str_32));
			AddResultString("R3");
			AddResultString("R3, ocr=", str_32);
			break;
		case MMC_RSP_R4:
			AddResultString("R4");
			break;
		case MMC_RSP_R5:
			AddResultString("R5");
			break;
		}
		break;
	}

	case FRAMETYPE_CRC:
	{
		if (channel != mSettings->mCommandChannel)
			break;
		char str_crc[8];

		AnalyzerHelpers::GetNumberString(frame.mData1, Hexadecimal, 7, str_crc, sizeof(str_crc));

		AddResultString("CRC");
		AddResultString("CRC=", str_crc);
		break;
	}

	case FRAMETYPE_DATA_CONTENTS:
	{
		if (channel != mSettings->mDataChannel0)
			break;

		char str_crc[8];
		AnalyzerHelpers::GetNumberString(frame.mData1, Hexadecimal, 8,
				str_crc, sizeof(str_crc));
		AddResultString(str_crc);
		break;
	}
	case FRAMETYPE_DATA_CRC:
	{
		if (channel != mSettings->mDataChannel0)
			break;

		char str_crc[8];
		AnalyzerHelpers::GetNumberString(frame.mData1, Hexadecimal, 8,
				str_crc, sizeof(str_crc));
		AddResultString(str_crc);
		break;
	}

	case FRAMETYPE_DATA_CRC_CHECK:
	{
		if (channel != mSettings->mDataChannel0)
			break;
		if (frame.mData1 == 5) {
			AddResultString("BAD CRC");
		} else {
			if (frame.mData1 == 2) {
				AddResultString("GOOD CRC");
			} else {
				AddResultString("UNEXPECTED CRC");
			}
		}
		break;
	}
	default:
		AddResultString("error");
	}
}